

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TransformFeedbackArraySizeValidator::
validateBuiltinVariable
          (TransformFeedbackArraySizeValidator *this,string *resource,GLint propValue,
          string *implementationName)

{
  bool bVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  allocator<char> local_361;
  string local_360;
  MessageBuilder local_340;
  MessageBuilder local_1b0;
  int local_2c;
  string *psStack_28;
  int arraySize;
  string *implementationName_local;
  string *psStack_18;
  GLint propValue_local;
  string *resource_local;
  TransformFeedbackArraySizeValidator *this_local;
  
  local_2c = 0;
  psStack_28 = implementationName;
  implementationName_local._4_4_ = propValue;
  psStack_18 = resource;
  resource_local = (string *)this;
  bVar1 = std::operator==(resource,"gl_Position");
  if (bVar1) {
    local_2c = 1;
  }
  pTVar2 = tcu::TestContext::getLog
                     ((this->super_TransformFeedbackResourceValidator).super_PropValidator.m_testCtx
                     );
  tcu::TestLog::operator<<(&local_1b0,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (&local_1b0,(char (*) [33])"Verifying array size, expecting ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_2c);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  if (local_2c != implementationName_local._4_4_) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TransformFeedbackResourceValidator).super_PropValidator.
                        m_testCtx);
    tcu::TestLog::operator<<(&local_340,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_340,(char (*) [13])"\tError, got ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)((long)&implementationName_local + 4));
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_340);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"resource array size invalid",&local_361);
    PropValidator::setError((PropValidator *)this,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::allocator<char>::~allocator(&local_361);
  }
  return;
}

Assistant:

void TransformFeedbackArraySizeValidator::validateBuiltinVariable (const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	DE_UNREF(implementationName);

	int arraySize = 0;

	if (resource == "gl_Position")
		arraySize = 1;
	else
		DE_ASSERT(false);

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying array size, expecting " << arraySize << tcu::TestLog::EndMessage;
	if (arraySize != propValue)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
		setError("resource array size invalid");
	}
}